

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# security_materials.cpp
# Opt level: O0

Error * ot::commissioner::security_material::GetDomainSM
                  (Error *__return_storage_ptr__,string *aDid,SecurityMaterials *aSM)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>
  __l;
  byte bVar1;
  bool bVar2;
  string *psVar3;
  char *pcVar4;
  Error *pEVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar6;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>
  *local_5e0;
  Error local_5c0;
  undefined1 local_598 [8];
  Error tokenError;
  ByteArray bytes_1;
  Error local_538;
  Error local_510;
  undefined1 local_4e8 [8];
  string path_1;
  v10 *local_4c0;
  char *local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  allocator local_489;
  string local_488;
  anon_class_1_0_00000001 local_462;
  v10 local_461;
  v10 *local_460;
  char *local_458;
  undefined1 local_450 [8];
  string out;
  Error local_408;
  undefined1 local_3e0 [8];
  ByteArray bytes;
  string local_3c0;
  Error local_3a0;
  Error local_378;
  undefined1 local_350 [8];
  string path;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>
  *element;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
  *__range2;
  string local_308;
  Error local_2e8;
  string local_2c0;
  string local_2a0;
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>
  local_279;
  ByteArray *local_278;
  ByteArray *local_270 [3];
  ByteArray *local_258;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>
  *local_250;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>
  local_248;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>
  local_220;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>
  local_1f8;
  iterator local_1d0;
  size_type local_1c8;
  undefined1 local_1c0 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
  smElements;
  string domPath;
  SecurityMaterials *aSM_local;
  string *aDid_local;
  Error *error;
  undefined1 local_158 [16];
  v10 *local_148;
  char *local_140;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_138;
  v10 *local_130;
  char *pcStack_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_118 [3];
  undefined1 local_100 [16];
  v10 *local_f0;
  char *local_e8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_e0;
  v10 *local_d8;
  char *pcStack_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  v10 *local_c0;
  v10 **local_b8;
  v10 *local_b0;
  v10 **local_a8;
  v10 **local_a0;
  v10 *local_98;
  char *pcStack_90;
  v10 **local_80;
  v10 *local_78;
  char *pcStack_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_68;
  undefined1 *local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_58;
  undefined8 local_50;
  undefined1 *local_48;
  Error **local_40;
  undefined1 *local_38;
  Error **local_30;
  undefined8 local_28;
  undefined1 *local_20;
  Error **local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_10;
  
  Error::Error(__return_storage_ptr__);
  std::__cxx11::string::string
            ((string *)
             &smElements.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_250 = &local_248;
  local_258 = &aSM->mCertificate;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>
  ::pair<const_char_(&)[9],_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_true>
            (local_250,(char (*) [9])0x39f3b1,&local_258);
  local_250 = &local_220;
  local_270[0] = &aSM->mPrivateKey;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>
  ::pair<const_char_(&)[9],_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_true>
            (local_250,(char (*) [9])0x39f351,local_270);
  local_250 = &local_1f8;
  local_278 = &aSM->mTrustAnchor;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>
  ::pair<const_char_(&)[7],_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_true>
            (local_250,(char (*) [7])0x39f2f3,&local_278);
  local_1d0 = &local_248;
  local_1c8 = 3;
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>
  ::allocator(&local_279);
  __l._M_len = local_1c8;
  __l._M_array = local_1d0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
            *)local_1c0,__l,&local_279);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>
  ::~allocator(&local_279);
  local_5e0 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>
               *)&local_1d0;
  do {
    local_5e0 = local_5e0 + -1;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>
    ::~pair(local_5e0);
  } while (local_5e0 != &local_248);
  SMRoot::Get_abi_cxx11_(&local_2a0,(SMRoot *)smRoot);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_2a0);
  if ((bVar1 & 1) == 0) {
    SMRoot::Get_abi_cxx11_(&local_2c0,(SMRoot *)smRoot);
    psVar3 = (string *)std::__cxx11::string::append((char *)&local_2c0);
    pcVar4 = (char *)std::__cxx11::string::append(psVar3);
    psVar3 = (string *)std::__cxx11::string::append(pcVar4);
    std::__cxx11::string::operator=
              ((string *)
               &smElements.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar3);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::string
              ((string *)&local_308,
               (string *)
               &smElements.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    PathExists(&local_2e8,&local_308);
    pEVar5 = Error::operator=(__return_storage_ptr__,&local_2e8);
    __range2._4_4_ = 0;
    bVar2 = commissioner::operator!=(pEVar5,(ErrorCode *)((long)&__range2 + 4));
    Error::~Error(&local_2e8);
    std::__cxx11::string::~string((string *)&local_308);
    if (!bVar2) {
      __end2 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
               ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
                        *)local_1c0);
      element = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>
                 *)std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
                   ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
                          *)local_1c0);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>_>
                                         *)&element), bVar2) {
        path.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>_>
             ::operator*(&__end2);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_350,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &smElements.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       path.field_2._8_8_);
        Error::Error(&local_378);
        std::__cxx11::string::string((string *)&local_3c0,(string *)local_350);
        PathExists(&local_3a0,&local_3c0);
        bVar2 = Error::operator!=(&local_378,&local_3a0);
        Error::~Error(&local_3a0);
        std::__cxx11::string::~string((string *)&local_3c0);
        Error::~Error(&local_378);
        if (bVar2) {
          bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = 8;
        }
        else {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3e0);
          ReadPemFile(&local_408,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3e0,
                      (string *)local_350);
          Error::operator=(__return_storage_ptr__,&local_408);
          Error::~Error(&local_408);
          Error::Error((Error *)((long)&out.field_2 + 8));
          pEVar5 = (Error *)((long)&out.field_2 + 8);
          bVar2 = Error::operator!=(__return_storage_ptr__,pEVar5);
          Error::~Error((Error *)((long)&out.field_2 + 8));
          if (bVar2) {
            if ((gVerbose & 1) == 0) {
              std::allocator<char>::allocator();
              pcVar4 = "security-materials";
              std::__cxx11::string::string((string *)&local_488,"security-materials",&local_489);
              GetDomainSM::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)(path_1.field_2._M_local_buf + 0xe));
              local_a8 = &local_4c0;
              local_b0 = (v10 *)(path_1.field_2._M_local_buf + 0xf);
              bVar6 = ::fmt::v10::operator()(local_b0);
              local_4b8 = (char *)bVar6.size_;
              local_4c0 = (v10 *)bVar6.data_;
              ::fmt::v10::detail::
              check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                        ();
              local_120 = &local_4b0;
              local_130 = local_4c0;
              pcStack_128 = local_4b8;
              local_138 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_350;
              local_80 = &local_130;
              local_148 = local_4c0;
              local_140 = local_4b8;
              local_78 = local_148;
              pcStack_70 = local_140;
              error = (Error *)::fmt::v10::
                               make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                                         (local_138,(v10 *)pcVar4,local_120);
              local_38 = local_158;
              local_40 = &error;
              local_28 = 0xd;
              fmt_00.size_ = 0xd;
              fmt_00.data_ = local_140;
              args_00.field_1.values_ = in_R9.values_;
              args_00.desc_ = (unsigned_long_long)local_40;
              local_30 = local_40;
              local_20 = local_38;
              local_18 = local_40;
              ::fmt::v10::vformat_abi_cxx11_(&local_4b0,local_148,fmt_00,args_00);
              Log(kError,&local_488,&local_4b0);
              std::__cxx11::string::~string((string *)&local_4b0);
              std::__cxx11::string::~string((string *)&local_488);
              std::allocator<char>::~allocator((allocator<char> *)&local_489);
            }
            else {
              GetDomainSM::anon_class_1_0_00000001::operator()(&local_462);
              local_b8 = &local_460;
              local_c0 = &local_461;
              bVar6 = ::fmt::v10::operator()(local_c0);
              local_458 = (char *)bVar6.size_;
              local_460 = (v10 *)bVar6.data_;
              ::fmt::v10::detail::
              check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                        ();
              local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_450;
              local_d8 = local_460;
              pcStack_d0 = local_458;
              local_e0 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_350;
              local_a0 = &local_d8;
              local_f0 = local_460;
              local_e8 = local_458;
              local_98 = local_f0;
              pcStack_90 = local_e8;
              local_118[0] = ::fmt::v10::
                             make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                                       (local_e0,(v10 *)pEVar5,local_c8);
              local_60 = local_100;
              local_68 = local_118;
              local_50 = 0xd;
              fmt.size_ = 0xd;
              fmt.data_ = local_e8;
              args.field_1.values_ = in_R9.values_;
              args.desc_ = (unsigned_long_long)local_68;
              local_58 = local_68;
              local_48 = local_60;
              local_10 = local_68;
              ::fmt::v10::vformat_abi_cxx11_((string *)local_450,local_f0,fmt,args);
              Console::Write((string *)local_450,kRed);
              std::__cxx11::string::~string((string *)local_450);
            }
          }
          else {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                      (*(vector<unsigned_char,_std::allocator<unsigned_char>_> **)
                        (path.field_2._8_8_ + 0x20),
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3e0);
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3e0);
          bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        }
        std::__cxx11::string::~string((string *)local_350);
        __gnu_cxx::
        __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>_>
        ::operator++(&__end2);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &smElements.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"tok.cbor");
      Error::Error(&local_510);
      std::__cxx11::string::string
                ((string *)
                 &bytes_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(string *)local_4e8);
      PathExists(&local_538,
                 (string *)
                 &bytes_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      bVar2 = Error::operator!=(&local_510,&local_538);
      Error::~Error(&local_538);
      std::__cxx11::string::~string
                ((string *)
                 &bytes_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      Error::~Error(&local_510);
      if (bVar2) {
        bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 0xb;
      }
      else {
        this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&tokenError.mMessage.field_2 + 8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(this);
        ReadHexStringFile((Error *)local_598,this,(string *)local_4e8);
        Error::Error(&local_5c0);
        bVar2 = Error::operator==(&local_5c0,(Error *)local_598);
        Error::~Error(&local_5c0);
        if (bVar2) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (&aSM->mCommissionerToken,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     ((long)&tokenError.mMessage.field_2 + 8));
        }
        Error::~Error((Error *)local_598);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   ((long)&tokenError.mMessage.field_2 + 8));
        bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      }
      std::__cxx11::string::~string((string *)local_4e8);
    }
  }
  bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
             *)local_1c0);
  std::__cxx11::string::~string
            ((string *)
             &smElements.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

Error GetDomainSM(const std::string &aDid, SecurityMaterials &aSM)
{
    Error               error;
    std::string         domPath;
    std::vector<SMPair> smElements{
        {"cert.pem", &aSM.mCertificate}, {"priv.pem", &aSM.mPrivateKey}, {"ca.pem", &aSM.mTrustAnchor}};

    // If SM root is unset, do nothing
    VerifyOrExit(!smRoot.Get().empty());

    domPath = smRoot.Get().append("dom/").append(aDid).append("/");
    SuccessOrExit(error = PathExists(domPath));
    for (const auto &element : smElements)
    {
        std::string path = domPath + element.first;
        if (ERROR_NONE != PathExists(path))
        {
            continue;
        }
        ByteArray bytes;
        error = ReadPemFile(bytes, path);
        if (error != ERROR_NONE)
        {
            if (gVerbose)
            {
                std::string out = fmt::format(FMT_STRING(SM_ERROR_MESSAGE_PEM_READ_FAILED), path);
                Console::Write(out, Console::Color::kRed);
            }
            else
            {
                LOG_ERROR(LOG_REGION_SECURITY_MATERIALS, SM_ERROR_MESSAGE_PEM_READ_FAILED, path);
            }
        }
        else
        {
            *element.second = bytes;
        }
    }

    do
    {
        std::string path = domPath + "tok.cbor";
        if (ERROR_NONE != PathExists(path))
        {
            break;
        }
        ByteArray bytes;
        Error     tokenError = ReadHexStringFile(bytes, path);
        if (ERROR_NONE == tokenError)
        {
            aSM.mCommissionerToken = bytes;
        }
    } while (false);
exit:
    return error;
}